

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObjectPrivate::reinitBindingStorageAfterThreadMove(QObjectPrivate *this)

{
  pointer ppQVar1;
  ulong uVar2;
  
  QBindingStorage::reinitAfterThreadMove(&(this->super_QObjectData).bindingStorage);
  if ((this->super_QObjectData).children.d.size != 0) {
    uVar2 = 0;
    do {
      ppQVar1 = QList<QObject_*>::data(&(this->super_QObjectData).children);
      reinitBindingStorageAfterThreadMove((QObjectPrivate *)(ppQVar1[uVar2]->d_ptr).d);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(this->super_QObjectData).children.d.size);
  }
  return;
}

Assistant:

void QObjectPrivate::reinitBindingStorageAfterThreadMove()
{
    bindingStorage.reinitAfterThreadMove();
    for (int i = 0; i < children.size(); ++i)
        children[i]->d_func()->reinitBindingStorageAfterThreadMove();
}